

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgba.cpp
# Opt level: O2

void testRgba(string *tempDir)

{
  ushort *puVar1;
  string *psVar2;
  _Alloc_hider _Var3;
  byte bVar4;
  char cVar5;
  int iVar6;
  ostream *poVar7;
  Rgba *pRVar8;
  undefined4 *puVar9;
  void *pvVar10;
  int *piVar11;
  int y_1;
  half *phVar12;
  int x;
  long lVar13;
  int iVar14;
  int comp;
  RgbaChannels channels;
  long lVar15;
  char *__assertion;
  ulong uVar16;
  undefined8 in_R9;
  int y;
  uint uVar17;
  long lVar18;
  double dVar19;
  RgbaOutputFile out;
  half hStack_116;
  half hStack_114;
  half hStack_112;
  half local_100;
  half local_fe;
  half local_fc;
  half local_fa;
  double local_f8;
  int local_ec;
  string *local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  Array2D<Imf_3_2::Rgba> p1_1;
  Array2D<Imf_3_2::Rgba> p1;
  string fileName;
  Header header;
  
  poVar7 = std::operator<<((ostream *)&std::cout,"Testing the RGBA image interface");
  std::endl<char,std::char_traits<char>>(poVar7);
  if (((((_imath_half_to_float_table[0x4000] != 2.0) || (NAN(_imath_half_to_float_table[0x4000])))
       || (_imath_half_to_float_table[0x4200] != 3.0)) ||
      ((NAN(_imath_half_to_float_table[0x4200]) || (_imath_half_to_float_table[0x4400] != 4.0)))) ||
     ((NAN(_imath_half_to_float_table[0x4400]) ||
      ((_imath_half_to_float_table[0x3c00] != 1.0 || (NAN(_imath_half_to_float_table[0x3c00])))))))
  {
    __assertion = "x.r == 2.f && x.g == 3.f && x.b == 4.f && x.a == 1.f";
    uVar17 = 0x2f;
  }
  else {
    if ((((_imath_half_to_float_table[0x4500] == 5.0) && (!NAN(_imath_half_to_float_table[0x4500])))
        && (_imath_half_to_float_table[0x4600] == 6.0)) &&
       (((!NAN(_imath_half_to_float_table[0x4600]) && (_imath_half_to_float_table[0x4700] == 7.0))
        && ((!NAN(_imath_half_to_float_table[0x4700]) &&
            ((*_imath_half_to_float_table == 0.0 && (!NAN(*_imath_half_to_float_table))))))))) {
      p1._sizeX = 0x77;
      p1._sizeY = 0xed;
      local_e8 = tempDir;
      pRVar8 = (Rgba *)operator_new__(0x37158);
      p1._data = pRVar8;
      for (lVar18 = 0; lVar18 != 0x77; lVar18 = lVar18 + 1) {
        local_d0 = (double)(int)lVar18;
        local_d8 = local_d0 * 0.1;
        local_e0 = local_d0 * 0.2;
        local_d0 = local_d0 * 0.3;
        iVar14 = 0;
        for (lVar15 = 0; lVar15 != 0x768; lVar15 = lVar15 + 8) {
          local_f8 = (double)iVar14 * 0.1;
          dVar19 = sin(local_f8 + local_d8);
          Imath_3_2::half::operator=
                    ((half *)((long)&(pRVar8->r)._h + lVar15),(float)(dVar19 * 0.5 + 0.5));
          dVar19 = sin(local_f8 + local_e0);
          Imath_3_2::half::operator=
                    ((half *)((long)&(pRVar8->g)._h + lVar15),(float)(dVar19 * 0.5 + 0.5));
          dVar19 = sin(local_f8 + local_d0);
          puVar1 = (ushort *)((long)&(pRVar8->r)._h + lVar15);
          Imath_3_2::half::operator=((half *)(puVar1 + 2),(float)(dVar19 * 0.5 + 0.5));
          Imath_3_2::half::operator=
                    ((half *)((long)&(pRVar8->a)._h + lVar15),
                     (_imath_half_to_float_table[*puVar1] +
                      _imath_half_to_float_table[((half *)(puVar1 + 2))->_h] +
                     _imath_half_to_float_table[puVar1[1]]) / 3.0);
          iVar14 = iVar14 + 1;
        }
        pRVar8 = pRVar8 + 0xed;
      }
      bVar4 = IlmThread_3_2::supportsThreads();
      psVar2 = local_e8;
      if ((uint)bVar4 + (uint)bVar4 * 2 == -1) {
        anon_unknown.dwarf_2504c3::writeReadLayers(local_e8,false);
        anon_unknown.dwarf_2504c3::writeReadLayers(psVar2,true);
        poVar7 = std::operator<<((ostream *)&std::cout,"ok\n");
        std::endl<char,std::char_traits<char>>(poVar7);
        Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&p1);
        return;
      }
      local_ec = 0;
      cVar5 = IlmThread_3_2::supportsThreads();
      if (cVar5 != '\0') {
        Imf_3_2::setGlobalThreadCount(local_ec);
        poVar7 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
        iVar14 = Imf_3_2::globalThreadCount();
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar14);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      psVar2 = local_e8;
      for (uVar17 = 0; uVar17 != 2; uVar17 = uVar17 + 1) {
        for (channels = 0; channels != (WRITE_A|WRITE_G); channels = channels + WRITE_R) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &header,psVar2,"imf_test_rgba.exr");
          iVar14 = (int)&p1;
          anon_unknown.dwarf_2504c3::writeReadRGBA
                    (_header,iVar14,0xf,(Array2D<Imf_3_2::Rgba> *)(ulong)uVar17,channels,
                     (LineOrder)in_R9,_out);
          std::__cxx11::string::~string((string *)&header);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &header,psVar2,"imf_test_rgba.exr");
          anon_unknown.dwarf_2504c3::writeReadRGBA
                    (_header,iVar14,7,(Array2D<Imf_3_2::Rgba> *)(ulong)uVar17,channels,
                     (LineOrder)in_R9,_out);
          std::__cxx11::string::~string((string *)&header);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &header,psVar2,"imf_test_rgba.exr");
          anon_unknown.dwarf_2504c3::writeReadRGBA
                    (_header,iVar14,8,(Array2D<Imf_3_2::Rgba> *)(ulong)uVar17,channels,
                     (LineOrder)in_R9,_out);
          std::__cxx11::string::~string((string *)&header);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &header,psVar2,"imf_test_rgba.exr");
          anon_unknown.dwarf_2504c3::writeReadRGBA
                    (_header,iVar14,5,(Array2D<Imf_3_2::Rgba> *)(ulong)uVar17,channels,
                     (LineOrder)in_R9,_out);
          std::__cxx11::string::~string((string *)&header);
        }
      }
      poVar7 = std::operator<<((ostream *)&std::cout,"\nfile with missing and broken scan lines");
      std::endl<char,std::char_traits<char>>(poVar7);
      std::operator+(&fileName,local_e8,"imf_test_incomplete.exr");
      p1_1._sizeX = 300;
      p1_1._sizeY = 400;
      p1_1._data = (Rgba *)operator_new__(960000);
      local_f8 = 0.0;
      dVar19 = 0.0;
      while (dVar19 != 1.48219693752374e-321) {
        uVar17 = 0;
        local_d0 = (double)CONCAT44(local_d0._4_4_,(float)(int)(((ulong)dVar19 & 0xffffffff) % 0x17)
                                   );
        local_d8 = (double)CONCAT44(local_d8._4_4_,(float)(int)(((ulong)dVar19 & 0xffffffff) % 0x1d)
                                   );
        lVar18 = 0;
        local_e0 = dVar19;
        while( true ) {
          if (lVar18 == 0xc80) break;
          Imath_3_2::half::half(&local_fa,(float)(int)(short)((uVar17 & 0xffff) % 5));
          Imath_3_2::half::half(&local_fc,(float)(int)(short)((uVar17 & 0xffff) % 0x11));
          Imath_3_2::half::half(&local_fe,local_d0._0_4_);
          Imath_3_2::half::half(&local_100,local_d8._0_4_);
          *(ulong *)((long)&((p1_1._data)->r)._h + lVar18 + p1_1._sizeY * (long)local_f8) =
               CONCAT26(local_100._h,CONCAT24(local_fe._h,CONCAT22(local_fc._h,local_fa._h)));
          lVar18 = lVar18 + 8;
          uVar17 = uVar17 + 1;
        }
        local_f8 = (double)((long)local_f8 + 8);
        dVar19 = (double)((long)local_e0 + 1);
      }
      poVar7 = std::operator<<((ostream *)&std::cout,"writing");
      std::endl<char,std::char_traits<char>>(poVar7);
      remove(fileName._M_dataplus._M_p);
      _out = 0;
      hStack_116._h = 0;
      hStack_114._h = 0;
      hStack_112._h = 0;
      Imf_3_2::Header::Header(&header,400,300,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
      puVar9 = (undefined4 *)Imf_3_2::Header::compression();
      _Var3 = fileName._M_dataplus;
      *puVar9 = 2;
      iVar14 = Imf_3_2::globalThreadCount();
      Imf_3_2::RgbaOutputFile::RgbaOutputFile(&out,_Var3._M_p,&header,WRITE_RGBA,iVar14);
      Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)p1_1._data,1);
      iVar14 = (int)&out;
      Imf_3_2::RgbaOutputFile::writePixels(iVar14);
      Imf_3_2::RgbaOutputFile::breakScanLine(iVar14,10,10,'\n');
      Imf_3_2::RgbaOutputFile::breakScanLine(iVar14,0x19,10,'\n');
      Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
      Imf_3_2::Header::~Header(&header);
      _out = 300;
      hStack_116._h = 0;
      hStack_114._h = 0;
      hStack_112._h = 0;
      pvVar10 = operator_new__(960000);
      lVar18 = 0;
      for (lVar15 = 0; lVar15 != 300; lVar15 = lVar15 + 1) {
        for (lVar13 = 0; lVar13 != 400; lVar13 = lVar13 + 1) {
          *(undefined8 *)((long)pvVar10 + lVar13 * 8 + lVar18 * 400) = 0xbc00bc00bc00bc00;
        }
        lVar18 = lVar18 + 8;
      }
      std::operator<<((ostream *)&std::cout,"reading one scan line at a time,");
      std::ostream::flush();
      _Var3 = fileName._M_dataplus;
      iVar14 = Imf_3_2::globalThreadCount();
      Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&header,_Var3._M_p,iVar14);
      piVar11 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
      if (piVar11[2] - *piVar11 != 399) {
        __assert_fail("dw.max.x - dw.min.x + 1 == width",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0xee,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
      }
      if (piVar11[3] - piVar11[1] != 299) {
        __assert_fail("dw.max.y - dw.min.y + 1 == height",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0xef,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
      }
      if (*piVar11 != 0) {
        __assert_fail("dw.min.x == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0xf0,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
      }
      if (piVar11[1] != 0) {
        __assert_fail("dw.min.y == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0xf1,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
      }
      Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar10,1);
      for (uVar17 = 0;
          iVar14 = (int)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header
          , uVar17 != 300; uVar17 = uVar17 + 1) {
        Imf_3_2::RgbaInputFile::readPixels(iVar14);
        if ((uVar17 == 0x19) || (uVar17 == 10)) {
          __assert_fail("scanLineBroken",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x108,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
        if (0x95 < uVar17) {
          __assert_fail("scanLinePresent == (y < height / 2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x10a,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
      }
      poVar7 = std::operator<<((ostream *)&std::cout," comparing");
      std::endl<char,std::char_traits<char>>(poVar7);
      std::ostream::flush();
      lVar18 = (long)pvVar10 + 6;
      phVar12 = &(p1_1._data)->a;
      uVar16 = 0;
      do {
        if (uVar16 == 300) {
          Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
          Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&out);
          _out = 300;
          hStack_116._h = 0;
          hStack_114._h = 0;
          hStack_112._h = 0;
          pvVar10 = operator_new__(960000);
          lVar18 = 0;
          for (lVar15 = 0; lVar15 != 300; lVar15 = lVar15 + 1) {
            for (lVar13 = 0; lVar13 != 400; lVar13 = lVar13 + 1) {
              *(undefined8 *)((long)pvVar10 + lVar13 * 8 + lVar18 * 400) = 0xbc00bc00bc00bc00;
            }
            lVar18 = lVar18 + 8;
          }
          std::operator<<((ostream *)&std::cout,"reading multiple scan lines at a time,");
          std::ostream::flush();
          iVar6 = Imf_3_2::globalThreadCount();
          Imf_3_2::RgbaInputFile::RgbaInputFile
                    ((RgbaInputFile *)&header,fileName._M_dataplus._M_p,iVar6);
          piVar11 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
          if (piVar11[2] - *piVar11 != 399) {
            __assert_fail("dw.max.x - dw.min.x + 1 == width",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x12f,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
          if (piVar11[3] - piVar11[1] != 299) {
            __assert_fail("dw.max.y - dw.min.y + 1 == height",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x130,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
          if (*piVar11 == 0) {
            if (piVar11[1] == 0) {
              Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&header,(ulong)pvVar10,1);
              Imf_3_2::RgbaInputFile::readPixels(iVar14,0);
              __assert_fail("scanLinesMissing || scanLinesBroken",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                            ,0x146,
                            "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
            }
            __assert_fail("dw.min.y == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x132,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
          __assert_fail("dw.min.x == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x131,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
        for (lVar15 = 0; lVar15 != 400; lVar15 = lVar15 + 1) {
          if (((uVar16 < 0x96) && ((char)uVar16 != '\n')) && (((uint)uVar16 & 0xff) != 0x19)) {
            if (((((_imath_half_to_float_table[*(ushort *)(lVar18 + -6 + lVar15 * 8)] !=
                    _imath_half_to_float_table[phVar12[lVar15 * 4 + -3]._h]) ||
                  (NAN(_imath_half_to_float_table[*(ushort *)(lVar18 + -6 + lVar15 * 8)]) ||
                   NAN(_imath_half_to_float_table[phVar12[lVar15 * 4 + -3]._h]))) ||
                 (_imath_half_to_float_table[*(ushort *)(lVar18 + -4 + lVar15 * 8)] !=
                  _imath_half_to_float_table[phVar12[lVar15 * 4 + -2]._h])) ||
                ((NAN(_imath_half_to_float_table[*(ushort *)(lVar18 + -4 + lVar15 * 8)]) ||
                  NAN(_imath_half_to_float_table[phVar12[lVar15 * 4 + -2]._h]) ||
                 (_imath_half_to_float_table[*(ushort *)(lVar18 + -2 + lVar15 * 8)] !=
                  _imath_half_to_float_table[phVar12[lVar15 * 4 + -1]._h])))) ||
               (NAN(_imath_half_to_float_table[*(ushort *)(lVar18 + -2 + lVar15 * 8)]) ||
                NAN(_imath_half_to_float_table[phVar12[lVar15 * 4 + -1]._h]))) {
LAB_00181e30:
              __assert_fail("t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                            ,0x119,
                            "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
            }
            if ((_imath_half_to_float_table[*(ushort *)(lVar18 + lVar15 * 8)] !=
                 _imath_half_to_float_table[phVar12[lVar15 * 4]._h]) ||
               (NAN(_imath_half_to_float_table[*(ushort *)(lVar18 + lVar15 * 8)]) ||
                NAN(_imath_half_to_float_table[phVar12[lVar15 * 4]._h]))) goto LAB_00181e30;
          }
          else if (((((_imath_half_to_float_table[*(ushort *)(lVar18 + -6 + lVar15 * 8)] != -1.0) ||
                     (NAN(_imath_half_to_float_table[*(ushort *)(lVar18 + -6 + lVar15 * 8)]))) ||
                    ((_imath_half_to_float_table[*(ushort *)(lVar18 + -4 + lVar15 * 8)] != -1.0 ||
                     ((NAN(_imath_half_to_float_table[*(ushort *)(lVar18 + -4 + lVar15 * 8)]) ||
                      (_imath_half_to_float_table[*(ushort *)(lVar18 + -2 + lVar15 * 8)] != -1.0))))
                    )) || (NAN(_imath_half_to_float_table[*(ushort *)(lVar18 + -2 + lVar15 * 8)])))
                  || ((_imath_half_to_float_table[*(ushort *)(lVar18 + lVar15 * 8)] != -1.0 ||
                      (NAN(_imath_half_to_float_table[*(ushort *)(lVar18 + lVar15 * 8)]))))) {
            __assert_fail("t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x11d,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
        }
        uVar16 = uVar16 + 1;
        lVar18 = lVar18 + 0xc80;
        phVar12 = phVar12 + p1_1._sizeY * 4;
      } while( true );
    }
    __assertion = "y.r == 5.f && y.g == 6.f && y.b == 7.f && y.a == 0.f";
    uVar17 = 0x32;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                ,uVar17,"void (anonymous namespace)::rgbaMethods()");
}

Assistant:

void
testRgba (const std::string& tempDir)
{
    try
    {
        cout << "Testing the RGBA image interface" << endl;

        rgbaMethods ();

        const int W = 237;
        const int H = 119;

        Array2D<Rgba> p1 (H, W);
        fillPixels (p1, W, H);

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
            {
                for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
                {
                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_RGBA,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_RGB,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        WRITE_A,
                        LineOrder (lorder),
                        Compression (comp));

                    writeReadRGBA (
                        (tempDir + "imf_test_rgba.exr").c_str (),
                        W,
                        H,
                        p1,
                        RgbaChannels (WRITE_R | WRITE_B),
                        LineOrder (lorder),
                        Compression (comp));
                }
            }

            writeReadIncomplete (tempDir);
        }

        writeReadLayers (tempDir, false);
        writeReadLayers (tempDir, true);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}